

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_finishget(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  ushort uVar1;
  Table *events;
  GCObject *pGVar2;
  TValue *f;
  int iVar3;
  char *pcVar4;
  TValue *io1;
  bool bVar5;
  
  iVar3 = 2000;
LAB_001262fe:
  do {
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) {
      luaG_runerror(L,"\'__index\' chain too long; possible loop");
    }
    if (slot == (TValue *)0x0) {
      if ((t->tt_ & 0xf) == 5) {
        __assert_fail("!(((((((t))->tt_)) & 0x0F)) == (5))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xd9,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      f = luaT_gettmbyobj(L,t,TM_INDEX);
      uVar1 = f->tt_;
      if (uVar1 == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      if (slot->tt_ != 0) {
        __assert_fail("((((slot))->tt_) == (0))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xe0,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if (t->tt_ != 0x8005) {
        pcVar4 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_001264aa:
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xe1,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if ((t->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
        pcVar4 = "(((t)->value_).gc)->tt == 5";
        goto LAB_001264aa;
      }
      events = *(Table **)((t->value_).f + 0x28);
      if (((events == (Table *)0x0) || ((events->flags & 1) != 0)) ||
         (f = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]), f == (TValue *)0x0)) {
        val->tt_ = 0;
        return;
      }
      uVar1 = f->tt_;
    }
    if ((uVar1 & 0xf) != 5) {
      if ((uVar1 & 0xf) == 6) {
        luaT_callTM(L,f,t,key,val,1);
        return;
      }
      slot = (TValue *)0x0;
      t = f;
      goto LAB_001262fe;
    }
    if (uVar1 != 0x8005) {
      pcVar4 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_001264d2:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xed,
                    "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                   );
    }
    if (((Table *)(f->value_).gc)->tt != '\x05') {
      pcVar4 = "(((t)->value_).gc)->tt == 5";
      goto LAB_001264d2;
    }
    slot = luaH_get((Table *)(f->value_).gc,key);
    t = f;
    if (slot->tt_ != 0) {
      pGVar2 = (slot->value_).gc;
      (val->value_).gc = pGVar2;
      uVar1 = slot->tt_;
      val->tt_ = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)pGVar2->tt ||
          ((L != (lua_State *)0x0 && ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xee,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      return;
    }
  } while( true );
}

Assistant:

void luaV_finishget (lua_State *L, const TValue *t, TValue *key, StkId val,
                      const TValue *slot) {
  int loop;  /* counter to avoid infinite loops */
  const TValue *tm;  /* metamethod */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    if (slot == NULL) {  /* 't' is not a table? */
      lua_assert(!ttistable(t));
      tm = luaT_gettmbyobj(L, t, TM_INDEX);
      if (ttisnil(tm))
        luaG_typeerror(L, t, "index");  /* no metamethod */
      /* else will try the metamethod */
    }
    else {  /* 't' is a table */
      lua_assert(ttisnil(slot));
      tm = fasttm(L, hvalue(t)->metatable, TM_INDEX);  /* table's metamethod */
      if (tm == NULL) {  /* no metamethod? */
        setnilvalue(val);  /* result is nil */
        return;
      }
      /* else will try the metamethod */
    }
    if (ttisfunction(tm)) {  /* is metamethod a function? */
      luaT_callTM(L, tm, t, key, val, 1);  /* call it */
      return;
    }
    t = tm;  /* else try to access 'tm[key]' */
    if (luaV_fastget(L,t,key,slot,luaH_get)) {  /* fast track? */
      setobj2s(L, val, slot);  /* done */
      return;
    }
    /* else repeat (tail call 'luaV_finishget') */
  }
  luaG_runerror(L, "'__index' chain too long; possible loop");
}